

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshTopology::Create(ON_MeshTopology *this)

{
  uint *puVar1;
  undefined4 *puVar2;
  ON_MeshFaceSide *pOVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  ON_MeshFace *pOVar13;
  ON_MeshFaceSide *pOVar14;
  ON_MeshFaceSide *pOVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint *puVar19;
  uint *puVar20;
  ON_MeshTopologyVertex *pOVar21;
  ON_MeshTopologyEdge *pOVar22;
  void *__s;
  int *piVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  int iVar31;
  uint uVar32;
  uint *puVar33;
  ON_MeshTopologyFace *pOVar34;
  ulong uVar35;
  size_t sVar36;
  size_t __n;
  ON_MeshFaceSide *e;
  ON_Workspace ws;
  
  if (this->m_b32IsValid == 1) {
    return true;
  }
  iVar4 = this->m_b32IsValid;
  if (iVar4 == 0) {
    this->m_b32IsValid = -1;
LAB_00519408:
    Destroy(this);
    iVar5 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    sVar36 = (size_t)iVar5;
    if (sVar36 == 0) {
LAB_005195d8:
      iVar31 = 0;
    }
    else {
      uVar6 = (this->m_mesh->m_F).m_count;
      puVar19 = (uint *)GetIntArray(this,iVar5);
      ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,sVar36);
      if ((-1 < iVar5) && (iVar5 <= (this->m_topv_map).m_capacity)) {
        (this->m_topv_map).m_count = iVar5;
      }
      puVar20 = ON_Mesh::GetVertexLocationIds(this->m_mesh,0,(uint *)(this->m_topv_map).m_a,puVar19)
      ;
      if (puVar20 == (uint *)0x0) {
        Destroy(this);
        goto LAB_005195d8;
      }
      iVar31 = (this->m_topv_map).m_a[puVar19[sVar36 - 1]];
      ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,sVar36);
      if ((-1 < iVar5) && (iVar5 <= (this->m_topv_map).m_capacity)) {
        (this->m_topv_map).m_count = iVar5;
      }
      ON_SimpleArray<ON_MeshTopologyVertex>::SetCapacity(&this->m_topv,(long)iVar31 + 1);
      iVar31 = 0;
      while( true ) {
        uVar7 = (this->m_topv).m_count;
        if (iVar5 <= iVar31) break;
        pOVar21 = ON_SimpleArray<ON_MeshTopologyVertex>::AppendNew(&this->m_topv);
        lVar24 = (long)iVar31;
        pOVar21->m_vi = (int *)(puVar19 + lVar24);
        iVar9 = iVar31;
        do {
          lVar24 = lVar24 + 1;
          iVar26 = iVar5;
          if ((long)sVar36 <= lVar24) break;
          iVar26 = iVar9 + 1;
          iVar9 = iVar26;
        } while (uVar7 == (this->m_topv_map).m_a[puVar19[lVar24]]);
        pOVar21->m_v_count = iVar26 - iVar31;
        iVar31 = iVar26;
      }
      iVar31 = 1;
      if ((1 < (int)uVar7) && (0 < iVar5 && 0 < (int)uVar6)) {
        ON_Workspace::ON_Workspace(&ws);
        e = (ON_MeshFaceSide *)ON_Workspace::GetMemory(&ws,(ulong)(uVar6 * 4) * 0x14);
        uVar16 = ON_Mesh::GetMeshFaceSideList(this->m_mesh,(uint *)(this->m_topv_map).m_a,&e);
        pOVar15 = e;
        if (0 < (int)uVar16) {
          uVar35 = (ulong)uVar16;
          ON_MeshFaceSide::SortByVertexIndex(e,uVar35);
          uVar17 = 0;
          uVar27 = 0;
          while ((int)uVar27 < (int)uVar16) {
            lVar24 = (long)(int)uVar27;
            pOVar3 = pOVar15 + lVar24;
            pOVar14 = pOVar15 + lVar24;
            puVar19 = pOVar15[lVar24 + 1].m_vi + 1;
            do {
              lVar24 = lVar24 + 1;
              uVar8 = uVar16;
              if ((long)uVar35 <= lVar24) break;
              if (((ON_MeshFaceSide *)(puVar19 + -1))->m_vi[0] != pOVar3->m_vi[0]) {
                uVar8 = uVar27 + 1;
                break;
              }
              uVar27 = uVar27 + 1;
              uVar32 = *puVar19;
              puVar19 = puVar19 + 5;
              uVar8 = uVar27;
            } while (uVar32 == pOVar14->m_vi[1]);
            uVar27 = uVar8;
            uVar17 = uVar17 + 1;
          }
          ON_SimpleArray<ON_MeshTopologyEdge>::SetCapacity(&this->m_tope,(ulong)uVar17);
          puVar19 = (uint *)GetIntArray(this,uVar16);
          uVar17 = 0;
LAB_0051962d:
          if ((int)uVar17 < (int)uVar16) {
            pOVar22 = ON_SimpleArray<ON_MeshTopologyEdge>::AppendNew(&this->m_tope);
            lVar24 = (long)(int)uVar17;
            pOVar3 = pOVar15 + lVar24;
            uVar27 = pOVar3->m_vi[0];
            pOVar22->m_topvi[0] = uVar27;
            uVar8 = pOVar3->m_vi[1];
            pOVar22->m_topvi[1] = uVar8;
            pOVar22->m_topfi = (int *)puVar19;
            pOVar22->m_topf_count = 0;
            puVar33 = &pOVar3->m_fi;
            uVar32 = uVar17;
            puVar20 = puVar19;
            do {
              puVar19 = puVar20 + 1;
              lVar24 = lVar24 + 1;
              *puVar20 = *puVar33;
              pOVar22->m_topf_count = pOVar22->m_topf_count + 1;
              uVar17 = uVar16;
              if ((long)uVar35 <= lVar24) break;
              if (puVar33[3] != uVar27) {
                uVar17 = uVar32 + 1;
                break;
              }
              uVar17 = uVar32 + 1;
              puVar1 = puVar33 + 4;
              puVar33 = puVar33 + 5;
              uVar32 = uVar17;
              puVar20 = puVar19;
            } while (*puVar1 == uVar8);
            goto LAB_0051962d;
          }
          uVar16 = (this->m_tope).m_count;
          sVar36 = (ulong)uVar7 << 2;
          __s = onmalloc(sVar36);
          lVar24 = 0;
          memset(__s,0,sVar36);
          pOVar22 = (this->m_tope).m_a;
          uVar35 = 0;
          if (0 < (int)uVar16) {
            uVar35 = (ulong)uVar16;
          }
          for (; uVar35 * 0x18 - lVar24 != 0; lVar24 = lVar24 + 0x18) {
            piVar23 = (int *)((long)__s + (long)*(int *)((long)pOVar22->m_topvi + lVar24) * 4);
            *piVar23 = *piVar23 + 1;
            piVar23 = (int *)((long)__s + (long)*(int *)((long)pOVar22->m_topvi + lVar24 + 4) * 4);
            *piVar23 = *piVar23 + 1;
          }
          piVar23 = GetIntArray(this,uVar16 * 2);
          pOVar21 = (this->m_topv).m_a;
          for (sVar28 = 0; sVar36 != sVar28; sVar28 = sVar28 + 4) {
            iVar31 = *(int *)((long)__s + sVar28);
            if (0 < (long)iVar31) {
              (&pOVar21->m_topei)[sVar28] = piVar23;
              piVar23 = piVar23 + iVar31;
            }
          }
          onfree(__s);
          pOVar21 = (this->m_topv).m_a;
          piVar23 = ((this->m_tope).m_a)->m_topvi + 1;
          for (uVar29 = 0; uVar35 != uVar29; uVar29 = uVar29 + 1) {
            iVar31 = ((ON_MeshTopologyEdge *)(piVar23 + -1))->m_topvi[0];
            iVar5 = *piVar23;
            piVar12 = pOVar21[iVar31].m_topei;
            iVar9 = pOVar21[iVar31].m_tope_count;
            pOVar21[iVar31].m_tope_count = iVar9 + 1;
            piVar12[iVar9] = (int)uVar29;
            piVar12 = pOVar21[iVar5].m_topei;
            iVar31 = pOVar21[iVar5].m_tope_count;
            pOVar21[iVar5].m_tope_count = iVar31 + 1;
            piVar12[iVar31] = (int)uVar29;
            piVar23 = piVar23 + 6;
          }
          ON_SimpleArray<ON_MeshTopologyFace>::SetCapacity(&this->m_topf,(ulong)uVar6);
          if ((int)uVar6 <= (this->m_topf).m_capacity) {
            (this->m_topf).m_count = uVar6;
          }
          __n = (ulong)uVar6 * 0x14;
          memset((this->m_topf).m_a,0,__n);
          pOVar34 = (this->m_topf).m_a;
          for (lVar24 = 0; __n - lVar24 != 0; lVar24 = lVar24 + 0x14) {
            puVar2 = (undefined4 *)((long)pOVar34->m_topei + lVar24);
            *puVar2 = 0xffffffff;
            puVar2[1] = 0xffffffff;
            puVar2[2] = 0xffffffff;
            puVar2[3] = 0xffffffff;
          }
          for (uVar29 = 0; uVar29 != uVar35; uVar29 = uVar29 + 1) {
            pOVar22 = (this->m_tope).m_a + uVar29;
            for (lVar24 = 0; lVar24 < pOVar22->m_topf_count; lVar24 = lVar24 + 1) {
              iVar31 = pOVar22->m_topfi[lVar24];
              piVar23 = (this->m_topv_map).m_a;
              pOVar13 = (this->m_mesh->m_F).m_a;
              iVar5 = piVar23[pOVar13[iVar31].vi[0]];
              iVar9 = piVar23[pOVar13[iVar31].vi[1]];
              iVar26 = piVar23[pOVar13[iVar31].vi[2]];
              pOVar34 = (this->m_topf).m_a + iVar31;
              iVar31 = piVar23[pOVar13[iVar31].vi[3]];
              iVar10 = pOVar22->m_topvi[0];
              iVar11 = pOVar22->m_topvi[1];
              iVar18 = (int)uVar29;
              if ((iVar10 == iVar31) && (iVar11 == iVar5)) {
                pOVar34->m_topei[0] = iVar18;
                pOVar34->m_reve[0] = '\0';
              }
              else if ((iVar10 == iVar5) && (iVar11 == iVar9)) {
                pOVar34->m_topei[1] = iVar18;
                pOVar34->m_reve[1] = '\0';
              }
              else if ((iVar10 == iVar9) && (iVar11 == iVar26)) {
                pOVar34->m_topei[2] = iVar18;
                pOVar34->m_reve[2] = '\0';
              }
              else if ((iVar10 == iVar26) && (iVar11 == iVar31)) {
                pOVar34->m_topei[3] = iVar18;
                pOVar34->m_reve[3] = '\0';
              }
              else if ((iVar10 == iVar5) && (iVar11 == iVar31)) {
                pOVar34->m_topei[0] = iVar18;
                pOVar34->m_reve[0] = '\x01';
              }
              else if ((iVar10 == iVar9) && (iVar11 == iVar5)) {
                pOVar34->m_topei[1] = iVar18;
                pOVar34->m_reve[1] = '\x01';
              }
              else if ((iVar10 == iVar26) && (iVar11 == iVar9)) {
                pOVar34->m_topei[2] = iVar18;
                pOVar34->m_reve[2] = '\x01';
              }
              else if ((iVar10 == iVar31) && (iVar11 == iVar26)) {
                pOVar34->m_topei[3] = iVar18;
                pOVar34->m_reve[3] = '\x01';
              }
            }
          }
          lVar24 = 0xc;
          for (lVar25 = 0; __n - lVar25 != 0; lVar25 = lVar25 + 0x14) {
            pOVar34 = (this->m_topf).m_a;
            iVar31 = *(int *)((long)pOVar34->m_topei + lVar25);
            if (((((iVar31 < 0) ||
                  (iVar5 = *(int *)((long)pOVar34->m_topei + lVar25 + 4), iVar5 < 0)) ||
                 (iVar9 = *(int *)((long)pOVar34->m_topei + lVar25 + 8), iVar9 == iVar31)) ||
                ((iVar5 == iVar9 || (iVar31 == iVar5)))) || (iVar9 < 0)) {
LAB_00519948:
              pauVar30 = (undefined1 (*) [16])((long)pOVar34->m_topei + lVar25);
              *pauVar30 = (undefined1  [16])0x0;
              *(undefined4 *)pauVar30[1] = 0;
            }
            else {
              pOVar13 = (this->m_mesh->m_F).m_a;
              if (*(int *)((long)pOVar13->vi + lVar24 + -4) == *(int *)((long)pOVar13->vi + lVar24))
              {
                *(int *)((long)pOVar34->m_topei + lVar25 + 0xc) = iVar9;
              }
              else {
                iVar26 = *(int *)((long)pOVar34->m_topei + lVar25 + 0xc);
                if (((iVar9 == iVar26) || (iVar5 == iVar26)) || ((iVar26 < 0 || (iVar31 == iVar26)))
                   ) goto LAB_00519948;
              }
            }
            lVar24 = lVar24 + 0x10;
          }
        }
        ON_Workspace::~ON_Workspace(&ws);
        iVar31 = 1;
      }
    }
    if (iVar4 == -1) goto LAB_005195ea;
  }
  else {
    iVar31 = iVar4;
    if (iVar4 + 1U < 2) goto LAB_00519408;
  }
  this->m_b32IsValid = iVar31;
LAB_005195ea:
  if (iVar31 != 1) {
    Destroy(this);
  }
  return iVar31 == 1;
}

Assistant:

bool ON_MeshTopology::Create()
{
  // When -1 == m_b32IsValid, this ON_MeshTopology
  // is the m_top field on an ON_Mesh and is being
  // created in an ON_Mesh::Topology() call and a
  // sleep lock is used to keep ON_Mesh::Topology()
  // thread safe.
  //
  // When 0 == m_b32IsValid, this ON_MeshTopology
  // is being created stand alone.
  //
  // When 1 == m_b32IsValid, this ON_MeshTopology
  // is already created and valid.

  if ( 1 == m_b32IsValid )
    return true;

  const int b32IsValid0 = m_b32IsValid;

  if ( 0 == b32IsValid0 )
  {
    // no sleep lock is being used
    m_b32IsValid = -1;
  }
  int b32IsValid = b32IsValid0;

  while ( 0 == b32IsValid || -1 == b32IsValid ) 
  {
    // while() is for flow control - this is a while() {... break;} statement.
    Destroy();
    b32IsValid = 0;

    // build vertex topology information
    const int fcount = m_mesh->FaceCount();
    const int vcount = m_mesh->VertexCount();
    if ( 0 == vcount )
      break;

    unsigned int* vindex = (unsigned int*)GetIntArray(vcount);
    m_topv_map.SetCapacity( vcount );
    m_topv_map.SetCount( vcount );
    if (  0 == m_mesh->GetVertexLocationIds( 
      0, // first id
      (unsigned int*)m_topv_map.Array(), // vertex ids returned here
      vindex
      ) )
    {
      Destroy();
      break;
    }

    {
      int topv_count = m_topv_map[vindex[vcount-1]]+1;
      m_topv_map.SetCapacity( vcount );
      m_topv_map.SetCount( vcount );
      m_topv.SetCapacity( topv_count );
      int vt0, vt1, topvi;
      for (vt0 = 0; vt0 < vcount; vt0 = vt1)
      {
        topvi = m_topv.Count();
#if defined(ON_DEBUG)
        if ( topvi != m_topv_map[vindex[vt0]] )
        {
          // 20 April 2010 Dale Lear:
          //  If you get this error, save the mesh and tell Dale Lear.
          ON_ERROR("ON_MeshTopology::Create() - topvi != vertex id from GetVertexLocationIds()");
        }
#endif
        ON_MeshTopologyVertex& topv = m_topv.AppendNew();
        topv.m_vi = (const int*)(vindex+vt0);
        for ( vt1=vt0+1; vt1<vcount && topvi == m_topv_map[vindex[vt1]]; vt1++ ) {
          // empty
        }
        topv.m_v_count = vt1-vt0;
      }
    }

    // build edge topology information
    const int topv_count = m_topv.Count();
    if ( topv_count >= 2 ) 
    {
      bool rc = false;
      int ei, ecnt, vi0, vi1, fi, efi, topfvi[4];
      ON_MeshFace f;

      if ( fcount > 0 && vcount > 0 ) 
      {
        // When working on this code be sure to test bug# 9271 and 9254 and file fsv_r4.3dm
        ON_Workspace ws;
        ON_MeshFaceSide* e = (ON_MeshFaceSide*)ws.GetMemory( 4*fcount*sizeof(*e) );
        ecnt = m_mesh->GetMeshFaceSideList( (const unsigned int*)m_topv_map.Array(), e );
        
        if ( ecnt > 0 ) 
        {
          rc = true;
          ON_MeshFaceSide::SortByVertexIndex( e, ecnt );

          // count number of topological edges and allocate storage
          int etop_count = 0;
          ei = 0;
          while( ei < ecnt ) 
          {
            vi0 = e[ei].m_vi[0];
            vi1 = e[ei].m_vi[1];
            ei++;
            while (ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 )
              ei++;
            etop_count++;
          }
          m_tope.SetCapacity(etop_count);

          // fill in the m_tope[] array information
          int* efindex = GetIntArray(ecnt);
          for ( ei = 0; ei < ecnt; /*empty*/ )
          {
            ON_MeshTopologyEdge& tope = m_tope.AppendNew();
            tope.m_topvi[0] = (int)(vi0 = e[ei].m_vi[0]);
            tope.m_topvi[1] = (int)(vi1 = e[ei].m_vi[1]);
            tope.m_topfi = efindex;
            tope.m_topf_count = 0;
            *efindex++ = (int)e[ei].m_fi;
            tope.m_topf_count++;
            ei++;
            while( ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 ) 
            {
              *efindex++ = (int)e[ei].m_fi;
              tope.m_topf_count++;
              ei++;
            }
          }
          efindex = 0; // memory deallocated by ~ON_MeshTopology()

          // connect vertices to edges;
          ecnt = m_tope.Count();
          int* ve_count = (int*)onmalloc(topv_count*sizeof(*ve_count));
          // set ve_count[topvi] = number of edges that begin or end at m_topv[topvi]
          memset( ve_count, 0, topv_count*sizeof(*ve_count));
          for ( ei = 0; ei < ecnt; ei++ ) {
            const ON_MeshTopologyEdge& tope = m_tope[ei];
            ve_count[tope.m_topvi[0]]++;
            ve_count[tope.m_topvi[1]]++;
          }
          // allocate and distribute storage for the mopv.m_topei[] array
          int* vei = GetIntArray(2*ecnt);
          for ( vi0 = 0; vi0 < topv_count; vi0++ ) {
            ON_MeshTopologyVertex& topv = m_topv[vi0];
            if ( ve_count[vi0] > 0 ) {
              topv.m_topei = vei;
              vei += ve_count[vi0];
            }
          }
          onfree(ve_count); ve_count = 0;
          vei = 0; // memory deallocated by ~ON_MeshTopology()

          // fill in the m_topv[].m_topei[] values
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
            ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
            vei = const_cast<int*>(topv0.m_topei);
            vei[topv0.m_tope_count++] = ei;
            vei = const_cast<int*>(topv1.m_topei);
            vei[topv1.m_tope_count++] = ei;
          }

          // build face topology information
          m_topf.SetCapacity(fcount);
          m_topf.SetCount(fcount);
          memset( m_topf.Array(), 0, fcount*sizeof(ON_MeshTopologyFace) );
          for ( fi = 0; fi < fcount; fi++ ) {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            f_local.m_topei[0] = -1;
            f_local.m_topei[1] = -1;
            f_local.m_topei[2] = -1;
            f_local.m_topei[3] = -1;
          }
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            for (efi = 0; efi < tope.m_topf_count; efi++ ) {
              // Because ON_MeshFace.vi[2] == ON_MeshFace.vi[3] for triangles,
              // we have topf.m_topei[j] BEGIN at ON_MeshFace.vi[(j+3)%4] and END at ON_MeshFace.vi[j]
              fi = tope.m_topfi[efi];
              f = m_mesh->m_F[fi];
              topfvi[0] = m_topv_map[f.vi[0]];
              topfvi[1] = m_topv_map[f.vi[1]];
              topfvi[2] = m_topv_map[f.vi[2]];
              topfvi[3] = m_topv_map[f.vi[3]];
              ON_MeshTopologyFace& topf = m_topf[fi];
              vi0 = tope.m_topvi[0];
              vi1 = tope.m_topvi[1];
              // unroll loop for speed
              if      ( vi0 == topfvi[3] && vi1 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 0;
              }
              else if ( vi0 == topfvi[0] && vi1 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 0;
              }
              else if ( vi0 == topfvi[1] && vi1 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 0;
              }
              else if ( vi0 == topfvi[2] && vi1 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 0;
              }
              else if ( vi1 == topfvi[3] && vi0 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 1;
              }
              else if ( vi1 == topfvi[0] && vi0 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 1;
              }
              else if ( vi1 == topfvi[1] && vi0 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 1;
              }
              else if ( vi1 == topfvi[2] && vi0 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 1;
              }
            }
          }
          for ( fi = 0; fi < fcount; fi++ ) 
          {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            bool bIsGood = false;
            if (    f_local.m_topei[0] >= 0 && f_local.m_topei[1] >= 0 && f_local.m_topei[2] >=0 
                 && f_local.m_topei[0] != f_local.m_topei[1] 
                 && f_local.m_topei[1] != f_local.m_topei[2] 
                 && f_local.m_topei[2] != f_local.m_topei[0] 
                 ) {
              if ( m_mesh->m_F[fi].IsTriangle() ) {
                bIsGood = true;
                f_local.m_topei[3] = f_local.m_topei[2];
              }
              else if (   f_local.m_topei[3] >= 0 
                       && f_local.m_topei[0] != f_local.m_topei[3] 
                       && f_local.m_topei[1] != f_local.m_topei[3] 
                       && f_local.m_topei[2] != f_local.m_topei[3] ) {
                bIsGood = true;
              }
            }
            if ( !bIsGood ) {
              f_local.m_topei[0] = 0;
              f_local.m_topei[1] = 0;
              f_local.m_topei[2] = 0;
              f_local.m_topei[3] = 0;
              f_local.m_reve[0] = 0;
              f_local.m_reve[1] = 0;
              f_local.m_reve[2] = 0;
              f_local.m_reve[3] = 0;
            }
          }

        }
      }
    }

    b32IsValid = 1;
    break;
  }

  if ( -1 != b32IsValid0 )
  {
    // no sleep lock is in use
    m_b32IsValid = b32IsValid;
  }

  if ( 1 != b32IsValid )
  {
    Destroy();
  }

  return (1 == b32IsValid);
}